

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void setup_block_rdmult(AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,
                       AQ_MODE aq_mode,MB_MODE_INFO *mbmi)

{
  int *rdmult;
  FRAME_UPDATE_TYPE update_type;
  FRAME_TYPE frame_type;
  aom_bit_depth_t bit_depth;
  aom_enc_pass aVar1;
  aom_tune_metric aVar2;
  AV1_PRIMARY *pAVar3;
  uint uVar4;
  int qindex;
  int iVar5;
  int layer_depth;
  int iVar6;
  undefined7 in_register_00000089;
  
  iVar5 = (cpi->rd).RDMULT;
  rdmult = &x->rdmult;
  x->rdmult = iVar5;
  iVar6 = (int)CONCAT71(in_register_00000089,aq_mode);
  if (iVar6 == 3) {
    if ((*(ushort *)&mbmi->field_0xa7 & 7) - 3 < 0xfffffffe) goto LAB_001ed5ff;
    iVar5 = av1_cyclic_refresh_get_rdmult(cpi->cyclic_refresh);
  }
  else {
    if (iVar6 == 2) {
      uVar4 = *(ushort *)&mbmi->field_0xa7 & 7;
    }
    else {
      if (iVar6 != 1) goto LAB_001ed5ff;
      if (cpi->vaq_refresh == 0) {
        uVar4 = *(ushort *)&mbmi->field_0xa7 & 7;
      }
      else {
        if (bsize < BLOCK_16X32) {
          uVar4 = x->mb_energy;
        }
        else {
          uVar4 = av1_log_block_var(cpi,x,bsize);
        }
        uVar4 = uVar4 & 7;
        *(ushort *)&mbmi->field_0xa7 = *(ushort *)&mbmi->field_0xa7 & 0xfff8 | (ushort)uVar4;
      }
    }
    pAVar3 = cpi->ppi;
    bit_depth = ((cpi->common).seq_params)->bit_depth;
    update_type = (pAVar3->gf_group).update_type[cpi->gf_frame_index];
    frame_type = (cpi->common).current_frame.frame_type;
    iVar5 = (pAVar3->p_rc).gfu_boost;
    iVar6 = (pAVar3->gf_group).layer_depth[cpi->gf_frame_index];
    qindex = av1_get_qindex(&(cpi->common).seg,uVar4,(cpi->common).quant_params.base_qindex);
    aVar1 = (cpi->oxcf).pass;
    uVar4 = 1;
    if (((aVar1 < AOM_RC_LAST_PASS) && (uVar4 = 0, aVar1 == AOM_RC_ONE_PASS)) &&
       (cpi->compressor_stage == '\0')) {
      uVar4 = (uint)(cpi->ppi->lap_enabled != 0);
    }
    layer_depth = 6;
    if (iVar6 < 6) {
      layer_depth = iVar6;
    }
    iVar6 = 0xf;
    if (iVar5 < 0x640) {
      iVar6 = iVar5 / 100;
    }
    iVar5 = av1_compute_rd_mult(qindex,bit_depth,update_type,layer_depth,iVar6,frame_type,
                                (cpi->oxcf).q_cfg.use_fixed_qp_offsets,uVar4,
                                (cpi->oxcf).tune_cfg.tuning);
  }
  *rdmult = iVar5;
LAB_001ed5ff:
  if (((cpi->common).delta_q_info.delta_q_present_flag != 0) &&
     ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) {
    iVar5 = av1_get_cb_rdmult(cpi,x,bsize,mi_row,mi_col);
    x->rdmult = iVar5;
  }
  aVar2 = (cpi->oxcf).tune_cfg.tuning;
  if ((aVar2 < (AOM_TUNE_BUTTERAUGLI|AOM_TUNE_VMAF_WITH_PREPROCESSING)) &&
     ((0xc02U >> (aVar2 & 0x1f) & 1) != 0)) {
    av1_set_ssim_rdmult(cpi,&x->errorperbit,bsize,mi_row,mi_col,rdmult);
    iVar5 = x->rdmult;
  }
  if ((cpi->oxcf).mode == '\x02') {
    iVar5 = (int)((ulong)((long)x->intra_sb_rdmult_modifier * (long)iVar5) >> 7);
  }
  iVar6 = 1;
  if (1 < iVar5) {
    iVar6 = iVar5;
  }
  *rdmult = iVar6;
  return;
}

Assistant:

static void setup_block_rdmult(const AV1_COMP *const cpi, MACROBLOCK *const x,
                               int mi_row, int mi_col, BLOCK_SIZE bsize,
                               AQ_MODE aq_mode, MB_MODE_INFO *mbmi) {
  x->rdmult = cpi->rd.RDMULT;

  if (aq_mode != NO_AQ) {
    assert(mbmi != NULL);
    if (aq_mode == VARIANCE_AQ) {
      if (cpi->vaq_refresh) {
        const int energy = bsize <= BLOCK_16X16
                               ? x->mb_energy
                               : av1_log_block_var(cpi, x, bsize);
        mbmi->segment_id = energy;
      }
      x->rdmult = set_rdmult(cpi, x, mbmi->segment_id);
    } else if (aq_mode == COMPLEXITY_AQ) {
      x->rdmult = set_rdmult(cpi, x, mbmi->segment_id);
    } else if (aq_mode == CYCLIC_REFRESH_AQ) {
      // If segment is boosted, use rdmult for that segment.
      if (cyclic_refresh_segment_id_boosted(mbmi->segment_id))
        x->rdmult = av1_cyclic_refresh_get_rdmult(cpi->cyclic_refresh);
    }
  }

#if !CONFIG_REALTIME_ONLY
  if (cpi->common.delta_q_info.delta_q_present_flag &&
      !cpi->sf.rt_sf.use_nonrd_pick_mode) {
    x->rdmult = av1_get_cb_rdmult(cpi, x, bsize, mi_row, mi_col);
  }
#endif  // !CONFIG_REALTIME_ONLY

  if (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIM ||
      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_IQ ||
      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIMULACRA2) {
    av1_set_ssim_rdmult(cpi, &x->errorperbit, bsize, mi_row, mi_col,
                        &x->rdmult);
  }
#if CONFIG_SALIENCY_MAP
  else if (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_SALIENCY_MAP) {
    av1_set_saliency_map_vmaf_rdmult(cpi, &x->errorperbit,
                                     cpi->common.seq_params->sb_size, mi_row,
                                     mi_col, &x->rdmult);
  }
#endif
#if CONFIG_TUNE_VMAF
  else if (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_WITHOUT_PREPROCESSING ||
           cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_MAX_GAIN ||
           cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_NEG_MAX_GAIN) {
    av1_set_vmaf_rdmult(cpi, x, bsize, mi_row, mi_col, &x->rdmult);
  }
#endif
#if CONFIG_TUNE_BUTTERAUGLI
  else if (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_BUTTERAUGLI) {
    av1_set_butteraugli_rdmult(cpi, x, bsize, mi_row, mi_col, &x->rdmult);
  }
#endif
  if (cpi->oxcf.mode == ALLINTRA) {
    x->rdmult = (int)(((int64_t)x->rdmult * x->intra_sb_rdmult_modifier) >> 7);
  }

  // Check to make sure that the adjustments above have not caused the
  // rd multiplier to be truncated to 0.
  x->rdmult = (x->rdmult > 0) ? x->rdmult : 1;
}